

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

void av1_pick_filter_restoration(YV12_BUFFER_CONFIG *src,AV1_COMP *cpi)

{
  undefined4 *puVar1;
  uint8_t uVar2;
  BLOCK_SIZE bsize;
  RestorationType RVar3;
  RefCntBuffer *pRVar4;
  SequenceHeader *pSVar5;
  RestUnitSearchInfo *pRVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  SequenceHeader *pSVar12;
  YV12_BUFFER_CONFIG *pYVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  RestorationUnitInfo *pRVar19;
  void *__s;
  int16_t *__s_00;
  long lVar20;
  _Bool is_wiener_disabled;
  uint uVar21;
  uint luma_unit_size;
  size_t size;
  undefined **ppuVar22;
  int iVar23;
  long lVar24;
  RestorationType r;
  AV1_COMMON *cm;
  ulong uVar25;
  RestorationInfo *pRVar26;
  int plane;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  double dVar31;
  undefined1 auVar32 [16];
  int min_unit_size;
  int plane_h_2;
  int plane_h;
  int rrow1;
  int rcol1;
  int plane_h_1;
  int rrow0;
  int rcol0;
  int plane_h_3;
  int plane_w;
  char local_26c [4];
  uint local_268;
  uint local_264;
  uint local_260;
  int local_25c;
  SequenceHeader *local_258;
  uint local_24c;
  int local_248;
  int local_244;
  int local_240;
  uint local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  ulong local_220;
  RestorationType local_218 [4];
  long local_208;
  RestorationInfo *local_200;
  AV1_COMMON *local_1f8;
  ulong local_1f0;
  uint local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  ulong local_1c0;
  double local_1b8;
  ThreadData *local_1b0;
  YV12_BUFFER_CONFIG *local_1a8;
  LOOP_FILTER_SPEED_FEATURES *local_1a0;
  YV12_BUFFER_CONFIG *local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  ulong local_170;
  YV12_BUFFER_CONFIG *local_168;
  YV12_BUFFER_CONFIG *local_160;
  AV1_COMMON *local_158;
  ThreadData *local_150;
  undefined4 local_148;
  int local_144;
  int local_140;
  RestUnitSearchInfo *local_138;
  LOOP_FILTER_SPEED_FEATURES *local_130;
  uint8_t *local_128;
  undefined4 local_120;
  uint8_t *local_118;
  undefined4 local_110;
  undefined1 local_f0;
  long local_e8 [9];
  undefined2 local_a0;
  undefined4 local_9e;
  undefined8 local_98;
  undefined2 local_90;
  undefined4 local_8e;
  undefined8 local_84;
  undefined8 local_78;
  undefined2 local_70;
  undefined4 local_6e;
  undefined8 local_68;
  undefined2 local_60;
  undefined4 local_5e;
  undefined8 local_54;
  int16_t *local_48;
  int16_t *piStack_40;
  
  local_258 = (cpi->common).seq_params;
  local_1a0 = &(cpi->sf).lpf_sf;
  uVar2 = local_258->monochrome;
  local_264 = (uint)local_258->use_highbitdepth;
  local_198 = src;
  av1_fill_lr_rates(&(cpi->td).mb.mode_costs,(cpi->td).mb.e_mbd.tile_ctx);
  uVar18 = (cpi->sf).lpf_sf.min_lr_unit_size;
  local_268 = (cpi->sf).lpf_sf.max_lr_unit_size;
  local_260 = (uint)block_size_wide[((cpi->common).seq_params)->sb_size];
  if ((int)(uint)block_size_wide[((cpi->common).seq_params)->sb_size] < (int)uVar18) {
    local_260 = uVar18;
  }
  local_200 = (cpi->common).rst_info;
  local_208 = (ulong)(uVar2 == '\0') * 2 + 1;
  iVar16 = (int)local_208;
  uVar27 = 0;
  local_1f8 = &cpi->common;
  do {
    av1_get_upsampled_plane_size(local_1f8,(uint)(uVar27 != 0),(int *)&local_168,&local_238);
    uVar18 = local_260;
    iVar14 = av1_lr_count_units(local_260,(int)local_168);
    iVar15 = av1_lr_count_units(uVar18,local_238);
    aom_free((&(cpi->common).rst_info[0].unit_info)[uVar27]);
    size = (long)(iVar15 * iVar14) << 6;
    pRVar19 = (RestorationUnitInfo *)aom_memalign(0x10,size);
    (&(cpi->common).rst_info[0].unit_info)[uVar27] = pRVar19;
    if (pRVar19 == (RestorationUnitInfo *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate rsi->unit_info"
                        );
    }
    __s = aom_memalign(0x10,size);
    if (__s == (void *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate rusi");
    }
    memset(__s,0,size);
    uVar18 = local_264;
    *(void **)((long)(cpi->pick_lr_ctxt).rusi + uVar27) = __s;
    uVar27 = uVar27 + 8;
  } while ((uint)(iVar16 * 8) != uVar27);
  if ((int)local_268 < (int)local_260) {
    local_268 = local_260;
  }
  (cpi->td).mb.rdmult = (cpi->rd).RDMULT;
  local_1a8 = &cpi->trial_frame_rst;
  iVar16 = aom_realloc_frame_buffer
                     (local_1a8,(cpi->common).superres_upscaled_width,
                      (cpi->common).superres_upscaled_height,local_258->subsampling_x,
                      local_258->subsampling_y,local_264,0x20,(cpi->common).features.byte_alignment,
                      (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                      false,0);
  if (iVar16 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");
  }
  pRVar26 = local_200;
  local_48 = (int16_t *)0x0;
  piStack_40 = (int16_t *)0x0;
  if (((cpi->sf).lpf_sf.disable_wiener_filter == false) && ((char)uVar18 == '\0')) {
    __s_00 = (int16_t *)aom_memalign(0x20,0xc0000);
    (cpi->pick_lr_ctxt).dgd_avg = __s_00;
    if (__s_00 == (int16_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->pick_lr_ctxt.dgd_avg");
      __s_00 = (cpi->pick_lr_ctxt).dgd_avg;
    }
    local_48 = __s_00;
    memset(__s_00,0,0xc0000);
    piStack_40 = __s_00 + 0x30000;
  }
  cm = local_1f8;
  uVar18 = local_264;
  lVar20 = local_208 + -1;
  auVar32._8_4_ = (int)lVar20;
  auVar32._0_8_ = lVar20;
  auVar32._12_4_ = (int)((ulong)lVar20 >> 0x20);
  pRVar26->frame_restoration_type = RESTORE_NONE;
  auVar32 = auVar32 ^ _DAT_004cd030;
  if (auVar32._12_4_ != -0x80000000 || -0x80000000 < auVar32._8_4_) {
    (cpi->common).rst_info[1].frame_restoration_type = RESTORE_NONE;
  }
  if (auVar32._4_4_ != -0x80000000 || -0x7fffffff < auVar32._0_4_) {
    (cpi->common).rst_info[2].frame_restoration_type = RESTORE_NONE;
    *(undefined4 *)&(cpi->common).rst_tmpbuf = 0;
  }
  iVar16 = (cpi->sf).lpf_sf.disable_loop_restoration_luma;
  local_220 = 0;
  if (uVar2 == '\0') {
    local_220 = (ulong)((uint)((cpi->sf).lpf_sf.disable_loop_restoration_chroma == 0) * 2);
  }
  bVar28 = iVar16 != 0;
  local_26c[1] = (cpi->sf).lpf_sf.disable_wiener_filter;
  local_26c[2] = (cpi->sf).lpf_sf.disable_sgr_filter;
  local_26c[0] = '\0';
  if ((bool)local_26c[1] != false) {
    local_26c[0] = local_26c[2];
  }
  local_26c[3] = 1;
  if ((bool)local_26c[1] == false) {
    local_26c[3] = local_26c[2];
  }
  bVar29 = (int)local_220 == 0;
  if (!bVar29 || !bVar28) {
    uVar25 = (ulong)(iVar16 != 0);
    uVar27 = local_220 + 1;
    do {
      pRVar4 = (cpi->common).cur_frame;
      av1_get_upsampled_plane_size(cm,(uint)(uVar25 != 0),&local_238,(int *)local_218);
      av1_extend_frame((pRVar4->buf).store_buf_adr[uVar25 - 4],local_238,local_218[0],
                       *(int *)((long)(pRVar4->buf).store_buf_adr + (ulong)(uVar25 != 0) * 4 + -0x28
                               ),3,3,uVar18);
      uVar25 = uVar25 + 1;
    } while (uVar27 != uVar25);
  }
  local_1b0 = &cpi->td;
  local_1c0 = (ulong)(iVar16 != 0);
  uVar27 = (ulong)((uint)local_220 | 1);
  dVar31 = 1.79769313486232e+308;
  local_24c = local_268;
  local_220 = uVar27;
  pRVar26 = local_200;
  uVar18 = local_268;
  do {
    local_218[2] = 0;
    local_218[0] = RESTORE_NONE;
    local_218[1] = RESTORE_NONE;
    local_1b8 = dVar31;
    uVar21 = uVar18;
    if (bVar29 && bVar28) {
      dVar31 = 0.0;
      lVar24 = 0;
    }
    else {
      lVar24 = 0;
      lVar20 = 0;
      uVar27 = local_1c0;
      local_1e4 = uVar18;
      do {
        local_258 = (SequenceHeader *)(pRVar26 + uVar27);
        uVar18 = (uint)(uVar27 != 0);
        local_190 = lVar20;
        local_188 = lVar24;
        set_restoration_unit_size(cm,(RestorationInfo *)local_258,uVar18,uVar21);
        pYVar13 = local_198;
        local_138 = (cpi->pick_lr_ctxt).rusi[uVar27];
        local_168 = local_198;
        local_160 = local_1a8;
        local_150 = local_1b0;
        local_148 = (undefined4)uVar27;
        local_130 = local_1a0;
        pRVar4 = (cpi->common).cur_frame;
        local_158 = cm;
        av1_get_upsampled_plane_size(cm,uVar18,&local_238,&local_25c);
        pSVar12 = local_258;
        uVar25 = (ulong)((uint)(uVar27 != 0) * 4);
        local_144 = local_238;
        local_140 = local_25c;
        local_118 = pYVar13->store_buf_adr[uVar27 - 4];
        local_110 = *(undefined4 *)((long)pYVar13->store_buf_adr + (uVar25 - 0x28));
        local_128 = (pRVar4->buf).store_buf_adr[uVar27 - 4];
        local_120 = *(undefined4 *)((long)(pRVar4->buf).store_buf_adr + (uVar25 - 0x28));
        pSVar5 = (cpi->common).seq_params;
        bVar30 = false;
        if (uVar27 != 0) {
          bVar30 = pSVar5->subsampling_y != 0;
        }
        bsize = pSVar5->sb_size;
        local_244 = pSVar5->mib_size_log2;
        uVar21 = local_258->num_bits_height;
        uVar25 = (ulong)uVar21;
        av1_get_upsampled_plane_size(cm,uVar18,&local_25c,&local_1c4);
        iVar16 = pSVar12->max_frame_width;
        local_e8[6] = 0;
        local_e8[7] = 0;
        local_e8[4] = 0;
        local_e8[5] = 0;
        local_e8[2] = 0;
        local_e8[3] = 0;
        local_e8[0] = 0;
        local_e8[1] = 0;
        iVar14 = (cpi->common).tiles.rows;
        local_1f0 = uVar27;
        if (0 < iVar14) {
          local_23c = 8 >> bVar30;
          iVar23 = (int)(uVar21 * 3) / 2;
          iVar15 = (cpi->common).tiles.cols;
          lVar20 = 0;
          local_170 = uVar25;
          do {
            if (0 < iVar15) {
              iVar14 = (cpi->common).tiles.row_start_sb[lVar20];
              local_180 = lVar20;
              local_248 = (cpi->common).tiles.row_start_sb[lVar20 + 1];
              lVar20 = 0;
              local_1e0 = iVar14;
              do {
                local_1dc = (cpi->common).tiles.col_start_sb[lVar20];
                local_240 = (cpi->common).tiles.col_start_sb[lVar20 + 1];
                local_98 = 0xffea000ffff90003;
                local_e8[8] = 0xffea000ffff90003;
                local_90 = 0xf;
                local_a0 = 0xf;
                local_8e = 0x3fff9;
                local_9e = 0x3fff9;
                local_84 = 0x1fffffffe0;
                local_68 = 0xffea000ffff90003;
                local_78 = 0xffea000ffff90003;
                local_60 = 0xf;
                local_70 = 0xf;
                local_5e = 0x3fff9;
                local_6e = 0x3fff9;
                local_54 = 0x1fffffffe0;
                if (iVar14 < local_248) {
                  local_178 = lVar20;
                  do {
                    local_1d8 = iVar14;
                    local_1d4 = iVar14 << ((byte)local_244 & 0x1f);
                    iVar14 = local_1dc;
                    if (local_1dc < local_240) {
                      do {
                        iVar15 = av1_loop_restoration_corners_in_sb
                                           (cm,(int)uVar27,local_1d4,
                                            iVar14 << ((byte)local_244 & 0x1f),bsize,&local_1c8,
                                            &local_224,&local_1cc,&local_228);
                        if (iVar15 != 0) {
                          local_1d0 = iVar14;
                          iVar17 = local_228;
                          for (iVar15 = local_1cc; cm = local_1f8, uVar27 = local_1f0,
                              iVar14 = local_1d0, iVar15 < iVar17; iVar15 = iVar15 + 1) {
                            local_230 = iVar15 * (int)uVar25;
                            local_22c = local_1c4 - local_230;
                            if (iVar23 <= local_1c4 - local_230) {
                              local_22c = (int)uVar25;
                            }
                            local_22c = local_22c + local_230;
                            local_230 = local_230 - local_23c;
                            if (local_230 < 1) {
                              local_230 = 0;
                            }
                            if (local_22c < local_1c4) {
                              local_22c = local_22c - local_23c;
                            }
                            iVar14 = local_1c8;
                            if (local_1c8 < local_224) {
                              do {
                                local_238 = iVar14 * (int)uVar25;
                                iVar17 = local_25c - local_238;
                                if (iVar23 <= local_25c - local_238) {
                                  iVar17 = (int)uVar25;
                                }
                                local_234 = iVar17 + local_238;
                                iVar17 = *(int *)&local_258->frame_id_numbers_present_flag;
                                local_f0 = 0;
                                ppuVar22 = &restoration_search_funs;
                                lVar20 = 0;
                                do {
                                  if (local_26c[lVar20] == '\0') {
                                    (*(code *)*ppuVar22)
                                              (&local_238,iVar17 * iVar15 + iVar14,&local_168,
                                               local_158->rst_tmpbuf,0,(cpi->common).error);
                                  }
                                  lVar20 = lVar20 + 1;
                                  ppuVar22 = ppuVar22 + 1;
                                } while ((ulong)(1 < iVar16) + 3 != lVar20);
                                iVar14 = iVar14 + 1;
                                uVar25 = local_170;
                                iVar17 = local_228;
                              } while (iVar14 < local_224);
                            }
                          }
                        }
                        iVar14 = iVar14 + 1;
                      } while (iVar14 != local_240);
                    }
                    iVar14 = local_1d8 + 1;
                  } while (iVar14 != local_248);
                  iVar15 = (cpi->common).tiles.cols;
                  lVar20 = local_178;
                  iVar14 = local_1e0;
                }
                lVar20 = lVar20 + 1;
              } while (lVar20 < iVar15);
              iVar14 = (cpi->common).tiles.rows;
              lVar20 = local_180;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < iVar14);
          iVar16 = local_258->max_frame_width;
        }
        lVar20 = local_190;
        uVar21 = local_1e4;
        pRVar26 = local_200;
        lVar24 = 0;
        dVar31 = 1.79769313486232e+308;
        do {
          if ((local_26c[lVar24] == '\0') &&
             (dVar7 = (double)(local_e8[lVar24] >>
                              ((char)((cpi->common).seq_params)->bit_depth * '\x02' - 0x10U & 0x3f))
                      * 128.0 + (double)(cpi->td).mb.rdmult * (double)(local_e8[lVar24 + 4] >> 4) *
                                0.001953125, dVar7 < dVar31)) {
            local_218[local_1f0] = (RestorationType)lVar24;
            dVar31 = dVar7;
          }
          lVar24 = lVar24 + 1;
        } while ((ulong)(1 < iVar16) + 3 != lVar24);
        lVar20 = lVar20 + local_e8[(ulong)local_218[local_1f0] + 4];
        lVar24 = local_188 + local_e8[local_218[local_1f0]];
        uVar27 = local_1f0 + 1;
      } while (uVar27 != local_220);
      dVar31 = (double)(lVar20 >> 4);
      uVar27 = local_220;
    }
    lVar20 = local_208;
    dVar31 = (double)(lVar24 >>
                     ((char)((cpi->common).seq_params)->bit_depth * '\x02' - 0x10U & 0x3f)) * 128.0
             + (double)(cpi->td).mb.rdmult * dVar31 * 0.001953125;
    luma_unit_size = local_24c;
    if ((local_1b8 <= dVar31) || (luma_unit_size = local_268, bVar29 && bVar28)) break;
    bVar30 = true;
    uVar25 = local_1c0;
    do {
      RVar3 = local_218[uVar25];
      pRVar26[uVar25].frame_restoration_type = RVar3;
      if (RVar3 != RESTORE_NONE) {
        iVar16 = pRVar26[uVar25].num_rest_units;
        if (0 < (long)iVar16) {
          lVar24 = 0;
          do {
            pRVar6 = (cpi->pick_lr_ctxt).rusi[uVar25];
            puVar1 = (undefined4 *)((long)(pRVar6->wiener).vfilter + lVar24);
            pRVar19 = pRVar26[uVar25].unit_info;
            iVar14 = puVar1[(ulong)(RVar3 - RESTORE_WIENER) + 0xb];
            *(int *)((long)(pRVar19->wiener_info).vfilter + lVar24 + -0x10) = iVar14;
            if (iVar14 == 1) {
              uVar8 = *puVar1;
              uVar9 = puVar1[1];
              uVar10 = puVar1[2];
              uVar11 = puVar1[3];
              *(undefined1 (*) [16])((long)(pRVar19->wiener_info).hfilter + lVar24) =
                   *(undefined1 (*) [16])(puVar1 + 4);
              puVar1 = (undefined4 *)((long)(pRVar19->wiener_info).vfilter + lVar24);
              *puVar1 = uVar8;
              puVar1[1] = uVar9;
              puVar1[2] = uVar10;
              puVar1[3] = uVar11;
            }
            else {
              *(undefined4 *)((long)(pRVar19->sgrproj_info).xqd + lVar24 + 4) =
                   *(undefined4 *)((long)(pRVar6->sgrproj).xqd + lVar24 + 4);
              *(undefined8 *)((long)(pRVar19->sgrproj_info).xqd + lVar24 + -4) =
                   *(undefined8 *)((long)(pRVar6->sgrproj).xqd + lVar24 + -4);
            }
            lVar24 = lVar24 + 0x40;
          } while ((long)iVar16 * 0x40 != lVar24);
        }
        bVar30 = false;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar27);
    uVar18 = uVar21 >> 1;
    local_24c = uVar21;
    luma_unit_size = uVar21;
  } while (!bVar30 && local_260 <= uVar18);
  lVar24 = 0;
  do {
    set_restoration_unit_size(cm,pRVar26,(uint)(lVar24 != 0),luma_unit_size);
    lVar24 = lVar24 + 1;
    pRVar26 = pRVar26 + 1;
  } while (lVar20 != lVar24);
  if (((cpi->sf).lpf_sf.disable_wiener_filter == false) && ((char)local_264 == '\0')) {
    aom_free((cpi->pick_lr_ctxt).dgd_avg);
    (cpi->pick_lr_ctxt).dgd_avg = (int16_t *)0x0;
  }
  lVar20 = local_208;
  lVar24 = 0;
  do {
    aom_free((cpi->pick_lr_ctxt).rusi[lVar24]);
    (cpi->pick_lr_ctxt).rusi[lVar24] = (RestUnitSearchInfo *)0x0;
    lVar24 = lVar24 + 1;
  } while (lVar20 != lVar24);
  return;
}

Assistant:

void av1_pick_filter_restoration(const YV12_BUFFER_CONFIG *src, AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &cpi->td.mb;
  const SequenceHeader *const seq_params = cm->seq_params;
  const LOOP_FILTER_SPEED_FEATURES *lpf_sf = &cpi->sf.lpf_sf;
  const int num_planes = av1_num_planes(cm);
  const int highbd = cm->seq_params->use_highbitdepth;
  assert(!cm->features.all_lossless);

  av1_fill_lr_rates(&x->mode_costs, x->e_mbd.tile_ctx);

  // Select unit size based on speed feature settings, and allocate
  // rui structs based on this size
  int min_lr_unit_size = cpi->sf.lpf_sf.min_lr_unit_size;
  int max_lr_unit_size = cpi->sf.lpf_sf.max_lr_unit_size;

  // The minimum allowed unit size at a syntax level is 1 superblock.
  // Apply this constraint here so that the speed features code which sets
  // cpi->sf.lpf_sf.min_lr_unit_size does not need to know the superblock size
  min_lr_unit_size =
      AOMMAX(min_lr_unit_size, block_size_wide[cm->seq_params->sb_size]);

  max_lr_unit_size = AOMMAX(min_lr_unit_size, max_lr_unit_size);

  for (int plane = 0; plane < num_planes; ++plane) {
    cpi->pick_lr_ctxt.rusi[plane] = allocate_search_structs(
        cm, &cm->rst_info[plane], plane > 0, min_lr_unit_size);
  }

  x->rdmult = cpi->rd.RDMULT;

  // Allocate the frame buffer trial_frame_rst, which is used to temporarily
  // store the loop restored frame.
  if (aom_realloc_frame_buffer(
          &cpi->trial_frame_rst, cm->superres_upscaled_width,
          cm->superres_upscaled_height, seq_params->subsampling_x,
          seq_params->subsampling_y, highbd, AOM_RESTORATION_FRAME_BORDER,
          cm->features.byte_alignment, NULL, NULL, NULL, false, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate trial restored frame buffer");

  RestSearchCtxt rsc;

  // The buffers 'src_avg' and 'dgd_avg' are used to compute H and M buffers.
  // These buffers are only required for the AVX2 and NEON implementations of
  // av1_compute_stats. The buffer size required is calculated based on maximum
  // width and height of the LRU (i.e., from foreach_rest_unit_in_plane() 1.5
  // times the RESTORATION_UNITSIZE_MAX) allowed for Wiener filtering. The width
  // and height aligned to multiple of 16 is considered for intrinsic purpose.
  rsc.dgd_avg = NULL;
  rsc.src_avg = NULL;
#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
  // The buffers allocated below are used during Wiener filter processing.
  // Hence, allocate the same when Wiener filter is enabled. Make sure to
  // allocate these buffers only for the SIMD extensions that make use of them
  // (i.e. AVX2 for low bitdepth and NEON and SVE for low and high bitdepth).
#if HAVE_AVX2
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool allocate_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (allocate_buffers) {
    const int buf_size = sizeof(*cpi->pick_lr_ctxt.dgd_avg) * 6 *
                         RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    CHECK_MEM_ERROR(cm, cpi->pick_lr_ctxt.dgd_avg,
                    (int16_t *)aom_memalign(32, buf_size));

    rsc.dgd_avg = cpi->pick_lr_ctxt.dgd_avg;
    // When LRU width isn't multiple of 16, the 256 bits load instruction used
    // in AVX2 intrinsic can read data beyond valid LRU. Hence, in order to
    // silence Valgrind warning this buffer is initialized with zero. Overhead
    // due to this initialization is negligible since it is done at frame level.
    memset(rsc.dgd_avg, 0, buf_size);
    rsc.src_avg =
        rsc.dgd_avg + 3 * RESTORATION_UNITSIZE_MAX * RESTORATION_UNITSIZE_MAX;
    // Asserts the starting address of src_avg is always 32-bytes aligned.
    assert(!((intptr_t)rsc.src_avg % 32));
  }
#endif

  // Initialize all planes, so that any planes we skip searching will still have
  // valid data
  for (int plane = 0; plane < num_planes; plane++) {
    cm->rst_info[plane].frame_restoration_type = RESTORE_NONE;
  }

  // Decide which planes to search
  int plane_start, plane_end;

  if (lpf_sf->disable_loop_restoration_luma) {
    plane_start = AOM_PLANE_U;
  } else {
    plane_start = AOM_PLANE_Y;
  }

  if (num_planes == 1 || lpf_sf->disable_loop_restoration_chroma) {
    plane_end = AOM_PLANE_Y;
  } else {
    plane_end = AOM_PLANE_V;
  }

  // Derive the flags to enable/disable Loop restoration filters based on the
  // speed features 'disable_wiener_filter' and 'disable_sgr_filter'.
  bool disable_lr_filter[RESTORE_TYPES] = { false };
  av1_derive_flags_for_lr_processing(lpf_sf, disable_lr_filter);

  for (int plane = plane_start; plane <= plane_end; plane++) {
    const YV12_BUFFER_CONFIG *dgd = &cm->cur_frame->buf;
    const int is_uv = plane != AOM_PLANE_Y;
    int plane_w, plane_h;
    av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);
    av1_extend_frame(dgd->buffers[plane], plane_w, plane_h, dgd->strides[is_uv],
                     RESTORATION_BORDER, RESTORATION_BORDER, highbd);
  }

  double best_cost = DBL_MAX;
  int best_luma_unit_size = max_lr_unit_size;
  for (int luma_unit_size = max_lr_unit_size;
       luma_unit_size >= min_lr_unit_size; luma_unit_size >>= 1) {
    int64_t bits_this_size = 0;
    int64_t sse_this_size = 0;
    RestorationType best_rtype[MAX_MB_PLANE] = { RESTORE_NONE, RESTORE_NONE,
                                                 RESTORE_NONE };
    for (int plane = plane_start; plane <= plane_end; ++plane) {
      set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                                luma_unit_size);
      init_rsc(src, &cpi->common, x, lpf_sf, plane,
               cpi->pick_lr_ctxt.rusi[plane], &cpi->trial_frame_rst, &rsc);

      restoration_search(cm, plane, &rsc, disable_lr_filter);

      const int plane_num_units = cm->rst_info[plane].num_rest_units;
      const RestorationType num_rtypes =
          (plane_num_units > 1) ? RESTORE_TYPES : RESTORE_SWITCHABLE_TYPES;
      double best_cost_this_plane = DBL_MAX;
      for (RestorationType r = 0; r < num_rtypes; ++r) {
        // Disable Loop restoration filter based on the flags set using speed
        // feature 'disable_wiener_filter' and 'disable_sgr_filter'.
        if (disable_lr_filter[r]) continue;

        double cost_this_plane = RDCOST_DBL_WITH_NATIVE_BD_DIST(
            x->rdmult, rsc.total_bits[r] >> 4, rsc.total_sse[r],
            cm->seq_params->bit_depth);

        if (cost_this_plane < best_cost_this_plane) {
          best_cost_this_plane = cost_this_plane;
          best_rtype[plane] = r;
        }
      }

      bits_this_size += rsc.total_bits[best_rtype[plane]];
      sse_this_size += rsc.total_sse[best_rtype[plane]];
    }

    double cost_this_size = RDCOST_DBL_WITH_NATIVE_BD_DIST(
        x->rdmult, bits_this_size >> 4, sse_this_size,
        cm->seq_params->bit_depth);

    if (cost_this_size < best_cost) {
      best_cost = cost_this_size;
      best_luma_unit_size = luma_unit_size;
      // Copy parameters out of rusi struct, before we overwrite it at
      // the start of the next iteration
      bool all_none = true;
      for (int plane = plane_start; plane <= plane_end; ++plane) {
        cm->rst_info[plane].frame_restoration_type = best_rtype[plane];
        if (best_rtype[plane] != RESTORE_NONE) {
          all_none = false;
          const int plane_num_units = cm->rst_info[plane].num_rest_units;
          for (int u = 0; u < plane_num_units; ++u) {
            copy_unit_info(best_rtype[plane], &cpi->pick_lr_ctxt.rusi[plane][u],
                           &cm->rst_info[plane].unit_info[u]);
          }
        }
      }
      // Heuristic: If all best_rtype entries are RESTORE_NONE, this means we
      // couldn't find any good filters at this size. So we likely won't find
      // any good filters at a smaller size either, so skip
      if (all_none) {
        break;
      }
    } else {
      // Heuristic: If this size is worse than the previous (larger) size, then
      // the next size down will likely be even worse, so skip
      break;
    }
  }

  // Final fixup to set the correct unit size
  // We set this for all planes, even ones we have skipped searching,
  // so that other code does not need to care which planes were and weren't
  // searched
  for (int plane = 0; plane < num_planes; ++plane) {
    set_restoration_unit_size(cm, &cm->rst_info[plane], plane > 0,
                              best_luma_unit_size);
  }

#if HAVE_AVX2 || HAVE_NEON || HAVE_SVE
#if HAVE_AVX2
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter && !highbd;
#elif HAVE_NEON || HAVE_SVE
  bool free_buffers = !cpi->sf.lpf_sf.disable_wiener_filter;
#endif
  if (free_buffers) {
    aom_free(cpi->pick_lr_ctxt.dgd_avg);
    cpi->pick_lr_ctxt.dgd_avg = NULL;
  }
#endif
  for (int plane = 0; plane < num_planes; plane++) {
    aom_free(cpi->pick_lr_ctxt.rusi[plane]);
    cpi->pick_lr_ctxt.rusi[plane] = NULL;
  }
}